

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  KeyInfo *pKVar7;
  MemPage *pMVar8;
  long lVar9;
  int iVar10;
  uchar *pBuf;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  u8 *puVar16;
  u32 amt;
  code *unaff_R14;
  char cVar17;
  bool bVar18;
  i64 nCellKey;
  int local_88;
  int local_84;
  int local_6c;
  u64 local_38;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
      lVar9 = (pCur->info).nKey;
      if (lVar9 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar9 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_00174207;
        if (lVar9 + 1 == intKey) {
          *pRes = 0;
          iVar10 = sqlite3BtreeNext(pCur,0);
          if (iVar10 != 0x65) {
            if (iVar10 != 0) {
              return iVar10;
            }
            getCellInfo(pCur);
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
          }
        }
      }
    }
    unaff_R14 = (code *)0x0;
  }
  else {
    pKVar7 = pIdxKey->pKeyInfo;
    if (pKVar7->nAllField < 0xe) {
      uVar6 = pIdxKey->aMem->flags;
      bVar18 = *pKVar7->aSortOrder == '\0';
      pIdxKey->r1 = -bVar18 | 1;
      pIdxKey->r2 = -!bVar18 | 1;
      if ((uVar6 & 4) == 0) {
        if (((uVar6 & 0x39) == 0) && (pKVar7->aColl[0] == (CollSeq *)0x0)) {
          unaff_R14 = vdbeRecordCompareString;
          goto LAB_00173c71;
        }
        bVar18 = true;
      }
      else {
        unaff_R14 = vdbeRecordCompareInt;
LAB_00173c71:
        bVar18 = false;
      }
      if (bVar18) goto LAB_00173c77;
    }
    else {
LAB_00173c77:
      unaff_R14 = sqlite3VdbeRecordCompare;
    }
    pIdxKey->errCode = '\0';
  }
  iVar10 = moveToRoot(pCur);
  if (iVar10 != 0x10) {
    if (iVar10 != 0) {
      return iVar10;
    }
    local_88 = 0;
    do {
      pMVar8 = pCur->pPage;
      iVar10 = pMVar8->nCell - 1;
      uVar14 = iVar10 >> (1U - (char)biasRight & 0x1f);
      pCur->ix = (u16)uVar14;
      if (unaff_R14 == (code *)0x0) {
        uVar12 = 0;
        do {
          puVar16 = pMVar8->aDataOfst +
                    (CONCAT11(pMVar8->aCellIdx[(long)(int)uVar14 * 2],
                              pMVar8->aCellIdx[(long)(int)uVar14 * 2 + 1]) & pMVar8->maskPage);
          if (pMVar8->intKeyLeaf == '\0') {
LAB_00173ffb:
            sqlite3GetVarint(puVar16,&local_38);
            if ((long)local_38 < intKey) {
              uVar12 = uVar14 + 1;
              if ((int)uVar14 < iVar10) {
LAB_0017403d:
                uVar14 = (int)(iVar10 + uVar12) >> 1;
                cVar17 = '\0';
              }
              else {
                cVar17 = '\x04';
                local_84 = -1;
              }
            }
            else if (intKey < (long)local_38) {
              iVar10 = uVar14 - 1;
              if ((int)uVar12 < (int)uVar14) goto LAB_0017403d;
              cVar17 = '\x04';
              local_84 = 1;
            }
            else {
              pCur->ix = (u16)uVar14;
              if (pMVar8->leaf != '\0') {
                pCur->curFlags = pCur->curFlags | 2;
                (pCur->info).nKey = local_38;
                (pCur->info).nSize = 0;
                *pRes = 0;
                local_6c = 0;
                goto LAB_00174082;
              }
              cVar17 = '\b';
              uVar12 = uVar14;
            }
          }
          else {
            do {
              if (-1 < (char)*puVar16) {
                puVar16 = puVar16 + 1;
                goto LAB_00173ffb;
              }
              puVar16 = puVar16 + 1;
            } while (puVar16 < pMVar8->aDataEnd);
            local_6c = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c69,
                        "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
LAB_00174082:
            cVar17 = '\x01';
          }
        } while (cVar17 == '\0');
        if (cVar17 == '\x04') goto LAB_001740c3;
        if (cVar17 != '\b') goto LAB_00174165;
LAB_001740e9:
        if ((int)uVar12 < (int)(uint)pMVar8->nCell) {
          lVar9 = (ulong)(CONCAT11(pMVar8->aCellIdx[(long)(int)uVar12 * 2],
                                   pMVar8->aCellIdx[(long)(int)uVar12 * 2 + 1]) & pMVar8->maskPage)
                  + 3;
        }
        else {
          lVar9 = (ulong)pMVar8->hdrOffset + 0xb;
        }
        pbVar11 = pMVar8->aData + lVar9;
        bVar2 = pbVar11[-3];
        bVar3 = pbVar11[-2];
        bVar4 = pbVar11[-1];
        bVar5 = *pbVar11;
        pCur->ix = (u16)uVar12;
        local_88 = moveToChild(pCur,(uint)bVar5 |
                                    (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18);
        cVar17 = (local_88 != 0) * '\x02';
      }
      else {
        uVar12 = 0;
        do {
          puVar16 = pMVar8->aDataOfst;
          uVar13 = (ulong)(CONCAT11(pMVar8->aCellIdx[(long)(int)uVar14 * 2],
                                    pMVar8->aCellIdx[(long)(int)uVar14 * 2 + 1]) & pMVar8->maskPage)
          ;
          pbVar11 = puVar16 + uVar13;
          bVar2 = *pbVar11;
          if (pMVar8->max1bytePayload < bVar2) {
            bVar3 = pbVar11[1];
            if ((-1 < (char)bVar3) &&
               (uVar15 = (bVar2 & 0x7f) << 7 | (int)(char)bVar3, uVar15 <= pMVar8->maxLocal)) {
              local_84 = (*unaff_R14)(uVar15,puVar16 + uVar13 + 2,pIdxKey);
              goto LAB_00173e75;
            }
            (*pMVar8->xParseCell)(pMVar8,puVar16 + (uVar13 - pMVar8->childPtrSize),&pCur->info);
            uVar13 = (pCur->info).nKey;
            amt = (u32)uVar13;
            if (((int)amt < 2) ||
               (pCur->pBt->nPage < (uint)((uVar13 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10cb4,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
              local_88 = 0xb;
LAB_00173e56:
              bVar18 = false;
              cVar17 = '\v';
            }
            else {
              pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
              if (pBuf == (uchar *)0x0) {
                local_88 = 7;
                goto LAB_00173e56;
              }
              pCur->ix = (u16)uVar14;
              local_88 = accessPayload(pCur,0,amt,pBuf,0);
              puVar1 = pBuf + (amt & 0x7fffffff);
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              puVar1[4] = '\0';
              puVar1[5] = '\0';
              puVar1[6] = '\0';
              puVar1[7] = '\0';
              puVar1[8] = '\0';
              puVar1[9] = '\0';
              puVar1[10] = '\0';
              puVar1[0xb] = '\0';
              puVar1[0xc] = '\0';
              puVar1[0xd] = '\0';
              puVar1[0xe] = '\0';
              puVar1[0xf] = '\0';
              (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[0] = '\0';
              (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[1] = '\0';
              pCur->curFlags = pCur->curFlags & 0xfb;
              if (local_88 != 0) {
                sqlite3_free(pBuf);
                goto LAB_00173e56;
              }
              cVar17 = '\0';
              local_84 = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
              sqlite3_free(pBuf);
              bVar18 = true;
              local_88 = 0;
            }
            if (bVar18) goto LAB_00173e75;
          }
          else {
            local_84 = (*unaff_R14)(bVar2,pbVar11 + 1,pIdxKey);
LAB_00173e75:
            if (local_84 < 0) {
              uVar12 = uVar14 + 1;
            }
            else {
              if (local_84 == 0) {
                *pRes = 0;
                pCur->ix = (u16)uVar14;
                if (pIdxKey->errCode == '\0') {
                  cVar17 = '\v';
                  local_84 = 0;
                  local_88 = 0;
                }
                else {
                  local_84 = 0;
                  cVar17 = '\v';
                  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10cd4,
                              "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
                  local_88 = 0xb;
                }
                goto LAB_00173f30;
              }
              iVar10 = uVar14 - 1;
            }
            cVar17 = '\t';
            if ((int)uVar12 <= iVar10) {
              uVar14 = iVar10 + uVar12 >> 1;
              cVar17 = '\0';
            }
          }
LAB_00173f30:
        } while (cVar17 == '\0');
        if (cVar17 == '\t') {
LAB_001740c3:
          if (pMVar8->leaf == '\0') goto LAB_001740e9;
          pCur->ix = (u16)uVar14;
          *pRes = local_84;
          local_88 = 0;
          cVar17 = '\v';
        }
      }
LAB_00174165:
      if (cVar17 != '\0') {
        if ((cVar17 != '\v') && (cVar17 != '\x02')) {
          return local_6c;
        }
        (pCur->info).nSize = 0;
        return local_88;
      }
    } while( true );
  }
LAB_00174207:
  *pRes = -1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PAGE(pPage);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          const int nOverrun = 18;  /* Size of the overrun padding */
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
            rc = SQLITE_CORRUPT_PAGE(pPage);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+nOverrun );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}